

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

container_t *
container_and(container_t *c1,uint8_t type1,container_t *c2,uint8_t type2,uint8_t *result_type)

{
  _Bool _Var1;
  array_container_t *src_1;
  array_container_t *array2;
  run_container_t *dst;
  container_t *pcVar2;
  array_container_t *paVar3;
  array_container_t *dst_00;
  byte local_32;
  byte local_31;
  array_container_t *local_30;
  
  local_32 = type2;
  local_31 = type1;
  src_1 = (array_container_t *)container_unwrap_shared(c1,&local_31);
  array2 = (array_container_t *)container_unwrap_shared(c2,&local_32);
  local_30 = (array_container_t *)0x0;
  switch((uint)local_32 + (uint)local_31 * 4) {
  case 5:
    _Var1 = bitset_bitset_container_intersection
                      ((bitset_container_t *)src_1,(bitset_container_t *)array2,&local_30);
    goto LAB_0010962a;
  case 6:
    paVar3 = array_container_create();
    array_bitset_container_intersection(array2,(bitset_container_t *)src_1,paVar3);
    goto LAB_00109612;
  case 7:
    paVar3 = src_1;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x1334,
                  "container_t *container_and(const container_t *, uint8_t, const container_t *, uint8_t, uint8_t *)"
                 );
  case 9:
    paVar3 = array_container_create();
    *result_type = '\x02';
    array_bitset_container_intersection(src_1,(bitset_container_t *)array2,paVar3);
    return paVar3;
  case 10:
    paVar3 = array_container_create();
    array_container_intersection(src_1,array2,paVar3);
LAB_00109612:
    *result_type = '\x02';
    return paVar3;
  case 0xb:
    dst_00 = array_container_create();
    *result_type = '\x02';
    paVar3 = array2;
    goto LAB_001095d7;
  case 0xd:
    paVar3 = array2;
    array2 = src_1;
    break;
  case 0xe:
    dst_00 = array_container_create();
    *result_type = '\x02';
    paVar3 = src_1;
    src_1 = array2;
LAB_001095d7:
    array_run_container_intersection(src_1,(run_container_t *)paVar3,dst_00);
    return dst_00;
  case 0xf:
    dst = run_container_create();
    run_container_intersection((run_container_t *)src_1,(run_container_t *)array2,dst);
    pcVar2 = convert_run_to_efficient_container_and_free(dst,result_type);
    return pcVar2;
  }
  _Var1 = run_bitset_container_intersection
                    ((run_container_t *)array2,(bitset_container_t *)paVar3,&local_30);
LAB_0010962a:
  *result_type = '\x02' - _Var1;
  return local_30;
}

Assistant:

static inline container_t *container_and(
    const container_t *c1, uint8_t type1,
    const container_t *c2, uint8_t type2,
    uint8_t *result_type
){
    c1 = container_unwrap_shared(c1, &type1);
    c2 = container_unwrap_shared(c2, &type2);
    container_t *result = NULL;
    switch (PAIR_CONTAINER_TYPES(type1, type2)) {
        case CONTAINER_PAIR(BITSET,BITSET):
            *result_type = bitset_bitset_container_intersection(
                                const_CAST_bitset(c1),
                                const_CAST_bitset(c2), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(ARRAY,ARRAY):
            result = array_container_create();
            array_container_intersection(const_CAST_array(c1),
                                         const_CAST_array(c2),
                                         CAST_array(result));
            *result_type = ARRAY_CONTAINER_TYPE;  // never bitset
            return result;

        case CONTAINER_PAIR(RUN,RUN):
            result = run_container_create();
            run_container_intersection(const_CAST_run(c1),
                                       const_CAST_run(c2),
                                       CAST_run(result));
            return convert_run_to_efficient_container_and_free(
                        CAST_run(result), result_type);

        case CONTAINER_PAIR(BITSET,ARRAY):
            result = array_container_create();
            array_bitset_container_intersection(const_CAST_array(c2),
                                                const_CAST_bitset(c1),
                                                CAST_array(result));
            *result_type = ARRAY_CONTAINER_TYPE;  // never bitset
            return result;

        case CONTAINER_PAIR(ARRAY,BITSET):
            result = array_container_create();
            *result_type = ARRAY_CONTAINER_TYPE;  // never bitset
            array_bitset_container_intersection(const_CAST_array(c1),
                                                const_CAST_bitset(c2),
                                                CAST_array(result));
            return result;

        case CONTAINER_PAIR(BITSET,RUN):
            *result_type = run_bitset_container_intersection(
                                const_CAST_run(c2),
                                const_CAST_bitset(c1), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(RUN,BITSET):
            *result_type = run_bitset_container_intersection(
                                const_CAST_run(c1),
                                const_CAST_bitset(c2), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(ARRAY,RUN):
            result = array_container_create();
            *result_type = ARRAY_CONTAINER_TYPE;  // never bitset
            array_run_container_intersection(const_CAST_array(c1),
                                             const_CAST_run(c2),
                                             CAST_array(result));
            return result;

        case CONTAINER_PAIR(RUN,ARRAY):
            result = array_container_create();
            *result_type = ARRAY_CONTAINER_TYPE;  // never bitset
            array_run_container_intersection(const_CAST_array(c2),
                                             const_CAST_run(c1),
                                             CAST_array(result));
            return result;

        default:
            assert(false);
            __builtin_unreachable();
            return NULL;
    }
}